

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::exportInertial(SpatialInertia *inertia,xmlNodePtr parent_element)

{
  bool bVar1;
  xmlNodePtr parent_element_00;
  undefined8 uVar2;
  string bufStr;
  RotationalInertia rotInertia;
  string local_100;
  double local_e0;
  double local_d8;
  double local_d0 [2];
  double local_c0;
  double local_b8 [3];
  double local_a0 [4];
  Position local_80 [24];
  Rotation local_68 [72];
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,"inertial",0);
  uVar2 = xmlNewChild(parent_element_00,0,"mass",0);
  local_e0 = (double)iDynTree::SpatialInertia::getMass();
  bVar1 = doubleToStringWithClassicLocale(&local_e0,&local_100);
  xmlNewProp(uVar2,"value",local_100._M_dataplus._M_p);
  if (bVar1) {
    iDynTree::Rotation::Identity();
    iDynTree::SpatialInertia::getCenterOfMass();
    iDynTree::Transform::Transform((Transform *)&local_e0,local_68,local_80);
    bVar1 = exportTransform((Transform *)&local_e0,parent_element_00);
  }
  else {
    bVar1 = false;
  }
  uVar2 = xmlNewChild(parent_element_00,0,"inertia",0);
  iDynTree::SpatialInertia::getRotationalInertiaWrtCenterOfMass();
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = doubleToStringWithClassicLocale(&local_e0,&local_100);
  }
  xmlNewProp(uVar2,"ixx",local_100._M_dataplus._M_p);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = doubleToStringWithClassicLocale(&local_d8,&local_100);
  }
  xmlNewProp(uVar2,"ixy",local_100._M_dataplus._M_p);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = doubleToStringWithClassicLocale(local_d0,&local_100);
  }
  xmlNewProp(uVar2,"ixz",local_100._M_dataplus._M_p);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = doubleToStringWithClassicLocale(&local_c0,&local_100);
  }
  xmlNewProp(uVar2,"iyy",local_100._M_dataplus._M_p);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = doubleToStringWithClassicLocale(local_b8,&local_100);
  }
  xmlNewProp(uVar2,"iyz",local_100._M_dataplus._M_p);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = doubleToStringWithClassicLocale(local_a0,&local_100);
  }
  xmlNewProp(uVar2,"izz",local_100._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_100);
  return bVar1;
}

Assistant:

bool exportInertial(const SpatialInertia &inertia, xmlNodePtr parent_element)
{
    bool ok=true;
    std::string bufStr;
    xmlNodePtr inertial = xmlNewChild(parent_element, NULL, BAD_CAST "inertial", NULL);


    xmlNodePtr mass_xml = xmlNewChild(inertial, NULL, BAD_CAST "mass", NULL);
    ok = ok && doubleToStringWithClassicLocale(inertia.getMass(), bufStr);
    xmlNewProp(mass_xml, BAD_CAST "value", BAD_CAST bufStr.c_str());

    ok = ok && exportTransform(Transform(Rotation::Identity(), inertia.getCenterOfMass()), inertial);

    xmlNodePtr inertia_xml = xmlNewChild(inertial, NULL, BAD_CAST "inertia", NULL);
    RotationalInertia rotInertia = inertia.getRotationalInertiaWrtCenterOfMass();
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 0), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixx", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 1), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixy", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixz", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(1, 1), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "iyy", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(1, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "iyz", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(2, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "izz", BAD_CAST bufStr.c_str());

    return ok;
}